

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

AltNode * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::AppendSurrogatePairToDisjunction
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,codepoint_t codePoint,
          AltNode *lastAltNode)

{
  undefined8 in_RAX;
  AltNode *this_00;
  Node *head;
  undefined4 local_34;
  char16 lower;
  char16 upper;
  
  local_34 = (undefined4)((ulong)in_RAX >> 0x20);
  Js::NumberUtilities::CodePointAsSurrogatePair
            (codePoint,(char16 *)&local_34,(char16 *)((long)&local_34 + 2));
  this_00 = (AltNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x35916e);
  head = CreateSurrogatePairAtom(this,(char16)local_34,local_34._2_2_);
  AltNode::AltNode(this_00,head,(AltNode *)0x0);
  if (lastAltNode != (AltNode *)0x0) {
    lastAltNode->tail = this_00;
  }
  return this_00;
}

Assistant:

AltNode* Parser<P, IsLiteral>::AppendSurrogatePairToDisjunction(codepoint_t codePoint, AltNode *lastAltNode)
    {
        char16 lower, upper;
        Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &lower, &upper);

        AltNode* tailNode = Anew(ctAllocator, AltNode, CreateSurrogatePairAtom(lower, upper), nullptr);

        if (lastAltNode != nullptr)
        {
            lastAltNode->tail = tailNode;
        }

        return tailNode;
    }